

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O0

void __thiscall
google::protobuf::Reflection::SetString
          (Reflection *this,Message *message,FieldDescriptor *field,Cord *value)

{
  InlinedStringField *pIVar1;
  FieldDescriptor *pFVar2;
  bool bVar3;
  CppType CVar4;
  int number;
  Type TVar5;
  CppStringType CVar6;
  Reflection *pRVar7;
  Descriptor *actual;
  Descriptor *pDVar8;
  ExtensionSet *this_00;
  string *dst;
  Cord **ppCVar9;
  Cord *pCVar10;
  char *failure_msg;
  LogMessage *pLVar11;
  MicroString *pMVar12;
  OneofDescriptor *pOVar13;
  ArenaStringPtr *pAVar14;
  Arena *pAVar15;
  string local_f0;
  ArenaStringPtr *local_d0;
  ArenaStringPtr *str_2;
  MicroString *local_a8;
  MicroString *str_1;
  uint local_7c;
  uint32_t *puStack_78;
  uint32_t mask;
  uint32_t *states;
  LogMessage local_60;
  Voidify local_49;
  uint local_48;
  uint local_44;
  Nullable<const_char_*> local_40;
  Nullable<const_char_*> absl_log_internal_check_op_result;
  InlinedStringField *pIStack_30;
  uint32_t index;
  InlinedStringField *str;
  Cord *value_local;
  FieldDescriptor *field_local;
  Message *message_local;
  Reflection *this_local;
  
  str = (InlinedStringField *)value;
  value_local = (Cord *)field;
  field_local = (FieldDescriptor *)message;
  message_local = (Message *)this;
  pRVar7 = Message::GetReflection(message);
  if (this != pRVar7) {
    pDVar8 = this->descriptor_;
    actual = Message::GetDescriptor((Message *)field_local);
    anon_unknown_6::ReportReflectionUsageMessageError
              (pDVar8,actual,(FieldDescriptor *)value_local,"SetString");
  }
  pDVar8 = FieldDescriptor::containing_type((FieldDescriptor *)value_local);
  if (pDVar8 != this->descriptor_) {
    anon_unknown_6::ReportReflectionUsageError
              (this->descriptor_,(FieldDescriptor *)value_local,"SetString",
               "Field does not match message type.");
  }
  bVar3 = FieldDescriptor::is_repeated((FieldDescriptor *)value_local);
  if (bVar3) {
    anon_unknown_6::ReportReflectionUsageError
              (this->descriptor_,(FieldDescriptor *)value_local,"SetString",
               "Field is repeated; the method requires a singular field.");
  }
  CVar4 = FieldDescriptor::cpp_type((FieldDescriptor *)value_local);
  if (CVar4 != CPPTYPE_STRING) {
    anon_unknown_6::ReportReflectionUsageTypeError
              (this->descriptor_,(FieldDescriptor *)value_local,"SetString",CPPTYPE_STRING);
  }
  bVar3 = FieldDescriptor::is_extension((FieldDescriptor *)value_local);
  pIVar1 = str;
  if (bVar3) {
    this_00 = MutableExtensionSet(this,(Message *)field_local);
    number = FieldDescriptor::number((FieldDescriptor *)value_local);
    TVar5 = FieldDescriptor::type((FieldDescriptor *)value_local);
    dst = internal::ExtensionSet::MutableString_abi_cxx11_
                    (this_00,number,(FieldType)TVar5,(FieldDescriptor *)value_local);
    absl::lts_20250127::CopyCordToString((Cord *)pIVar1,dst);
    return;
  }
  CVar6 = FieldDescriptor::cpp_string_type((FieldDescriptor *)value_local);
  if (CVar6 != kView) {
    if (CVar6 == kCord) {
      bVar3 = internal::ReflectionSchema::InRealOneof(&this->schema_,(FieldDescriptor *)value_local)
      ;
      pIVar1 = str;
      if (!bVar3) {
        pCVar10 = MutableField<absl::lts_20250127::Cord>
                            (this,(Message *)field_local,(FieldDescriptor *)value_local);
        absl::lts_20250127::Cord::operator=(pCVar10,(Cord *)pIVar1);
        return;
      }
      bVar3 = HasOneofField(this,(Message *)field_local,(FieldDescriptor *)value_local);
      pFVar2 = field_local;
      if (!bVar3) {
        pOVar13 = FieldDescriptor::containing_oneof((FieldDescriptor *)value_local);
        ClearOneof(this,(Message *)pFVar2,pOVar13);
        pAVar15 = MessageLite::GetArena((MessageLite *)field_local);
        pCVar10 = Arena::Create<absl::lts_20250127::Cord>(pAVar15);
        ppCVar9 = MutableField<absl::lts_20250127::Cord*>
                            (this,(Message *)field_local,(FieldDescriptor *)value_local);
        *ppCVar9 = pCVar10;
      }
      pIVar1 = str;
      ppCVar9 = MutableField<absl::lts_20250127::Cord*>
                          (this,(Message *)field_local,(FieldDescriptor *)value_local);
      absl::lts_20250127::Cord::operator=(*ppCVar9,(Cord *)pIVar1);
      return;
    }
    if (CVar6 != kString) {
      return;
    }
  }
  bVar3 = IsInlined(this,(FieldDescriptor *)value_local);
  if (bVar3) {
    pIStack_30 = MutableField<google::protobuf::internal::InlinedStringField>
                           (this,(Message *)field_local,(FieldDescriptor *)value_local);
    absl_log_internal_check_op_result._4_4_ =
         internal::ReflectionSchema::InlinedStringIndex
                   (&this->schema_,(FieldDescriptor *)value_local);
    local_44 = absl::lts_20250127::log_internal::GetReferenceableValue
                         (absl_log_internal_check_op_result._4_4_);
    local_48 = absl::lts_20250127::log_internal::GetReferenceableValue(0);
    local_40 = absl::lts_20250127::log_internal::Check_GTImpl<unsigned_int,unsigned_int>
                         (&local_44,&local_48,"index > 0u");
    if (local_40 != (Nullable<const_char_*>)0x0) {
      failure_msg = absl::lts_20250127::implicit_cast<char_const*>(local_40);
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_60,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_reflection.cc"
                 ,0x84d,failure_msg);
      pLVar11 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_60);
      absl::lts_20250127::log_internal::Voidify::operator&&(&local_49,pLVar11);
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&local_60);
    }
    puStack_78 = MutableInlinedStringDonatedArray(this,(Message *)field_local);
    pIVar1 = pIStack_30;
    puStack_78 = puStack_78 + (absl_log_internal_check_op_result._4_4_ >> 5);
    local_7c = -2 << (absl_log_internal_check_op_result._4_1_ & 0x1f) |
               0xfffffffeU >> 0x20 - (absl_log_internal_check_op_result._4_1_ & 0x1f);
    absl::lts_20250127::Cord::operator_cast_to_string((string *)&str_1,(Cord *)str);
    pAVar15 = MessageLite::GetArena((MessageLite *)field_local);
    bVar3 = IsInlinedStringDonated(this,(Message *)field_local,(FieldDescriptor *)value_local);
    internal::InlinedStringField::Set
              (pIVar1,(string *)&str_1,pAVar15,bVar3,puStack_78,local_7c,(MessageLite *)field_local)
    ;
    std::__cxx11::string::~string((string *)&str_1);
  }
  else {
    bVar3 = IsMicroString(this,(FieldDescriptor *)value_local);
    if (bVar3) {
      bVar3 = internal::ReflectionSchema::InRealOneof(&this->schema_,(FieldDescriptor *)value_local)
      ;
      if ((bVar3) &&
         (bVar3 = HasOneofField(this,(Message *)field_local,(FieldDescriptor *)value_local),
         pFVar2 = field_local, !bVar3)) {
        pOVar13 = FieldDescriptor::containing_oneof((FieldDescriptor *)value_local);
        ClearOneof(this,(Message *)pFVar2,pOVar13);
        pMVar12 = MutableField<google::protobuf::internal::MicroString>
                            (this,(Message *)field_local,(FieldDescriptor *)value_local);
        internal::MicroString::InitDefault(pMVar12);
      }
      pMVar12 = MutableField<google::protobuf::internal::MicroString>
                          (this,(Message *)field_local,(FieldDescriptor *)value_local);
      local_a8 = pMVar12;
      absl::lts_20250127::Cord::operator_cast_to_string((string *)&str_2,(Cord *)str);
      pAVar15 = MessageLite::GetArena((MessageLite *)field_local);
      internal::MicroString::Set<google::protobuf::Arena*>(pMVar12,(string *)&str_2,pAVar15);
      std::__cxx11::string::~string((string *)&str_2);
    }
    else {
      bVar3 = internal::ReflectionSchema::InRealOneof(&this->schema_,(FieldDescriptor *)value_local)
      ;
      if ((bVar3) &&
         (bVar3 = HasOneofField(this,(Message *)field_local,(FieldDescriptor *)value_local),
         pFVar2 = field_local, !bVar3)) {
        pOVar13 = FieldDescriptor::containing_oneof((FieldDescriptor *)value_local);
        ClearOneof(this,(Message *)pFVar2,pOVar13);
        pAVar14 = MutableField<google::protobuf::internal::ArenaStringPtr>
                            (this,(Message *)field_local,(FieldDescriptor *)value_local);
        internal::ArenaStringPtr::InitDefault(pAVar14);
      }
      pAVar14 = MutableField<google::protobuf::internal::ArenaStringPtr>
                          (this,(Message *)field_local,(FieldDescriptor *)value_local);
      local_d0 = pAVar14;
      absl::lts_20250127::Cord::operator_cast_to_string(&local_f0,(Cord *)str);
      pAVar15 = MessageLite::GetArena((MessageLite *)field_local);
      internal::ArenaStringPtr::Set(pAVar14,&local_f0,pAVar15);
      std::__cxx11::string::~string((string *)&local_f0);
    }
  }
  return;
}

Assistant:

void Reflection::SetString(Message* message, const FieldDescriptor* field,
                           const absl::Cord& value) const {
  USAGE_MUTABLE_CHECK_ALL(SetString, SINGULAR, STRING);
  if (field->is_extension()) {
    return absl::CopyCordToString(value,
                                  MutableExtensionSet(message)->MutableString(
                                      field->number(), field->type(), field));
  } else {
    switch (field->cpp_string_type()) {
      case FieldDescriptor::CppStringType::kCord:
        if (schema_.InRealOneof(field)) {
          if (!HasOneofField(*message, field)) {
            ClearOneof(message, field->containing_oneof());
            *MutableField<absl::Cord*>(message, field) =
                Arena::Create<absl::Cord>(message->GetArena());
          }
          *(*MutableField<absl::Cord*>(message, field)) = value;
        } else {
          *MutableField<absl::Cord>(message, field) = value;
        }
        break;
      case FieldDescriptor::CppStringType::kView:
      case FieldDescriptor::CppStringType::kString: {
        if (IsInlined(field)) {
          auto* str = MutableField<InlinedStringField>(message, field);
          const uint32_t index = schema_.InlinedStringIndex(field);
          ABSL_DCHECK_GT(index, 0u);
          uint32_t* states =
              &MutableInlinedStringDonatedArray(message)[index / 32];
          uint32_t mask = ~(static_cast<uint32_t>(1) << (index % 32));
          str->Set(std::string(value), message->GetArena(),
                   IsInlinedStringDonated(*message, field), states, mask,
                   message);
        } else if (IsMicroString(field)) {
          if (schema_.InRealOneof(field) && !HasOneofField(*message, field)) {
            ClearOneof(message, field->containing_oneof());
            MutableField<MicroString>(message, field)->InitDefault();
          }
          auto* str = MutableField<MicroString>(message, field);
          str->Set(std::string(value), message->GetArena());
        } else {
          if (schema_.InRealOneof(field) && !HasOneofField(*message, field)) {
            ClearOneof(message, field->containing_oneof());
            MutableField<ArenaStringPtr>(message, field)->InitDefault();
          }
          auto* str = MutableField<ArenaStringPtr>(message, field);
          str->Set(std::string(value), message->GetArena());
        }
        break;
      }
    }
  }
}